

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O1

XMLByte * __thiscall
xercesc_4_0::XMLFormatter::getCharRef
          (XMLFormatter *this,XMLSize_t *count,XMLByte **ref,XMLCh *stdRef)

{
  short *psVar1;
  XMLByte *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  XMLSize_t charsEaten;
  undefined1 local_38 [8];
  XMLSize_t XVar4;
  
  if (*ref == (XMLByte *)0x0) {
    lVar5 = 0;
    if (stdRef != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)stdRef + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar1 != 0);
      lVar5 = (lVar5 >> 1) + -1;
    }
    iVar3 = (*this->fXCoder->_vptr_XMLTranscoder[3])
                      (this->fXCoder,stdRef,lVar5,this->fTmpBuf,0x4000,local_38,0);
    XVar4 = CONCAT44(extraout_var,iVar3);
    pXVar2 = this->fTmpBuf + XVar4;
    pXVar2[0] = '\0';
    pXVar2[1] = '\0';
    pXVar2[2] = '\0';
    pXVar2[3] = '\0';
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar4 + 4);
    *ref = (XMLByte *)CONCAT44(extraout_var_00,iVar3);
    memcpy((XMLByte *)CONCAT44(extraout_var_00,iVar3),this->fTmpBuf,XVar4 + 4);
    *count = XVar4;
  }
  return *ref;
}

Assistant:

const XMLByte* XMLFormatter::getCharRef(XMLSize_t     &count,
                                        XMLByte*      &ref,
                                        const XMLCh *  stdRef)
{
   if (!ref) {

       XMLSize_t charsEaten;
       const XMLSize_t outBytes =
           fXCoder->transcodeTo(stdRef, XMLString::stringLen(stdRef),
                                fTmpBuf, kTmpBufSize, charsEaten,
                                XMLTranscoder::UnRep_Throw);

       fTmpBuf[outBytes] = 0;
       fTmpBuf[outBytes + 1] = 0;
       fTmpBuf[outBytes + 2] = 0;
       fTmpBuf[outBytes + 3] = 0;

       ref = (XMLByte*) fMemoryManager->allocate
       (
           (outBytes + 4) * sizeof(XMLByte)
       );//new XMLByte[outBytes + 4];
       memcpy(ref, fTmpBuf, outBytes + 4);
       count = outBytes;
   }

   return ref;
}